

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QXmlStreamNotationDeclaration>::resize
          (QList<QXmlStreamNotationDeclaration> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QXmlStreamNotationDeclaration *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
      0x71c71c71c71c71c7 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QXmlStreamNotationDeclaration>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QXmlStreamNotationDeclaration **)0x0,
               (QArrayDataPointer<QXmlStreamNotationDeclaration> *)0x0);
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = (this->d).ptr;
      std::_Destroy_aux<false>::__destroy<QXmlStreamNotationDeclaration*>
                (pQVar3 + size,pQVar3 + lVar2);
      (this->d).size = size;
    }
  }
  lVar2 = (this->d).size;
  if (lVar2 < size) {
    pQVar3 = (this->d).ptr;
    std::__uninitialized_default_1<false>::__uninit_default<QXmlStreamNotationDeclaration*>
              (pQVar3 + lVar2,pQVar3 + size);
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }